

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.cpp
# Opt level: O2

void __thiscall
tcu::SurfaceAccess::SurfaceAccess
          (SurfaceAccess *this,SurfaceAccess *parent,int x,int y,int width,int height)

{
  this->m_surface = parent->m_surface;
  this->m_colorMask = parent->m_colorMask;
  this->m_x = x + parent->m_x;
  this->m_y = y + parent->m_y;
  this->m_width = width;
  this->m_height = height;
  return;
}

Assistant:

SurfaceAccess::SurfaceAccess (const SurfaceAccess& parent, int x, int y, int width, int height)
	: m_surface			(parent.m_surface)
	, m_colorMask		(parent.m_colorMask)
	, m_x				(parent.m_x + x)
	, m_y				(parent.m_y + y)
	, m_width			(width)
	, m_height			(height)
{
}